

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

void test_bitset_lenrange_cardinality(void)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint32_t i;
  ulong uVar5;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  local_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  uVar4 = 0;
  do {
    if (uVar4 < 0x40) {
      uVar2 = 0xffffffffffffffff >> (~(byte)uVar4 & 0x3f);
      uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
      uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
      uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    }
    else {
      iVar1 = 0x40;
      if (0x7f < uVar4) {
        uVar2 = 1;
        do {
          uVar5 = *(ulong *)(&local_78 + uVar2 * 2) -
                  (*(ulong *)(&local_78 + uVar2 * 2) >> 1 & 0x5555555555555555);
          uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
          iVar1 = iVar1 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) *
                                       0x101010101010101 >> 0x38);
          uVar2 = uVar2 + 1;
        } while (uVar4 >> 6 != uVar2);
      }
      bVar3 = ~(byte)uVar4;
      uVar2 = (ulong)(*(long *)(&local_78 + (uVar4 >> 6 & 0x3ffffff) * 2) << (bVar3 & 0x3f)) >>
              (bVar3 & 0x3f);
      uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
      uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
      uVar2 = (ulong)((uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38) + iVar1);
    }
    uVar4 = uVar4 + 1;
    _assert_true((ulong)(uVar4 == uVar2),"bitset_lenrange_cardinality(words, 0, k) == k + 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x25);
  } while (uVar4 != 0x100);
  uVar4 = 0x100;
  do {
    iVar1 = 0x40;
    uVar2 = 1;
    do {
      uVar5 = *(ulong *)(&local_78 + uVar2 * 2) -
              (*(ulong *)(&local_78 + uVar2 * 2) >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      iVar1 = iVar1 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
      uVar2 = uVar2 + 1;
    } while (uVar4 >> 6 != uVar2);
    uVar2 = (ulong)(*(long *)(&local_78 + (uVar4 >> 6 & 0x3ffffff) * 2) << (~(byte)uVar4 & 0x3f)) >>
            (~(byte)uVar4 & 0x3f);
    uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
    uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
    _assert_true((ulong)(iVar1 + (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) *
                                              0x101010101010101 >> 0x38) == 0x100),
                 "bitset_lenrange_cardinality(words, 0, k) == 4 * 64",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x28);
    uVar4 = uVar4 + 1;
  } while ((int)uVar4 != 0x200);
  return;
}

Assistant:

DEFINE_TEST(test_bitset_lenrange_cardinality) {
    uint64_t words[] = {
        ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), 0, 0, 0, 0};
    for (int k = 0; k < 64 * 4; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == k + 1);  // ok
    }
    for (int k = 64 * 4; k < 64 * 8; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == 4 * 64);  // ok
    }
}